

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O1

void av1_svc_set_reference_was_previous(AV1_COMP *cpi)

{
  uint uVar1;
  AV1_PRIMARY *pAVar2;
  long lVar3;
  uint *puVar4;
  
  pAVar2 = cpi->ppi;
  puVar4 = &(cpi->common).current_frame.frame_number;
  if (pAVar2->use_svc != 0) {
    puVar4 = &(cpi->svc).current_superframe;
  }
  uVar1 = *puVar4;
  (pAVar2->rtc_ref).reference_was_previous_frame = true;
  if (uVar1 != 0) {
    (pAVar2->rtc_ref).reference_was_previous_frame = false;
    lVar3 = -7;
    do {
      if (((pAVar2->rtc_ref).ref_idx[lVar3] != 0) &&
         ((pAVar2->rtc_ref).buffer_time_index[(pAVar2->rtc_ref).refresh[lVar3]] == uVar1 - 1)) {
        (pAVar2->rtc_ref).reference_was_previous_frame = true;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

void av1_svc_set_reference_was_previous(AV1_COMP *cpi) {
  RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
  // Check if the encoded frame had some reference that was the
  // previous frame.
  const unsigned int current_frame =
      cpi->ppi->use_svc ? cpi->svc.current_superframe
                        : cpi->common.current_frame.frame_number;
  rtc_ref->reference_was_previous_frame = true;
  if (current_frame > 0) {
    rtc_ref->reference_was_previous_frame = false;
    for (unsigned int i = 0; i < INTER_REFS_PER_FRAME; i++) {
      if (rtc_ref->reference[i]) {
        const int ref_frame_map_idx = rtc_ref->ref_idx[i];
        if (rtc_ref->buffer_time_index[ref_frame_map_idx] == current_frame - 1)
          rtc_ref->reference_was_previous_frame = true;
      }
    }
  }
}